

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O0

bool __thiscall
Lib::DArray<std::pair<Kernel::TermOrderingDiagram::Branch,_Kernel::TermOrderingDiagram::Branch>_>::
ensure(DArray<std::pair<Kernel::TermOrderingDiagram::Branch,_Kernel::TermOrderingDiagram::Branch>_>
       *this,size_t s)

{
  unsigned_long *puVar1;
  void *placement;
  Node *pNVar2;
  Node *in_RSI;
  pair<Kernel::TermOrderingDiagram::Branch,_Kernel::TermOrderingDiagram::Branch> *in_RDI;
  pair<Kernel::TermOrderingDiagram::Branch,_Kernel::TermOrderingDiagram::Branch> *newArray;
  void *mem;
  size_t newCapacity;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc8;
  unsigned_long local_28;
  Node *local_20;
  Branch local_18 [2];
  bool local_1;
  
  if ((in_RDI->second)._node < in_RSI) {
    local_28 = (long)(in_RDI->second)._node << 1;
    local_18[0]._node = in_RSI;
    puVar1 = std::max<unsigned_long>((unsigned_long *)local_18,&local_28);
    local_20 = (Node *)*puVar1;
    placement = Lib::alloc((size_t)in_RDI);
    pNVar2 = (Node *)array_new<std::pair<Kernel::TermOrderingDiagram::Branch,Kernel::TermOrderingDiagram::Branch>>
                               (placement,in_stack_ffffffffffffffc8);
    if (in_RDI[1].first._node != (Node *)0x0) {
      array_delete<std::pair<Kernel::TermOrderingDiagram::Branch,Kernel::TermOrderingDiagram::Branch>>
                (in_RDI,in_stack_ffffffffffffffb8);
      Lib::free(in_RDI[1].first._node);
    }
    (in_RDI->first)._node = local_18[0]._node;
    (in_RDI->second)._node = local_20;
    in_RDI[1].first._node = pNVar2;
    local_1 = false;
  }
  else {
    (in_RDI->first)._node = in_RSI;
    local_1 = true;
  }
  return local_1;
}

Assistant:

inline bool ensure(size_t s)
  {
    if (_capacity >= s) {
      _size = s;
      return true;
    }

    size_t newCapacity = std::max(s, _capacity*2);

    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"DArray<>");
    C* newArray=array_new<C>(mem, newCapacity);

    if(_array) {
      array_delete(_array, _capacity);
      DEALLOC_KNOWN(_array,sizeof(C)*_capacity,"DArray<>");
    }
    _size = s;
    _capacity = newCapacity;
    _array = newArray;
    return false;
  }